

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O3

char * blogc_format_date(char *date,bc_trie_t *global,bc_trie_t *local)

{
  char *pcVar1;
  bc_error_t *err;
  bc_error_t *local_18;
  
  pcVar1 = blogc_get_variable("DATE_FORMAT",global,local);
  if (date == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    if (pcVar1 == (char *)0x0) {
      pcVar1 = bc_strdup(date);
      return pcVar1;
    }
    local_18 = (bc_error_t *)0x0;
    pcVar1 = blogc_convert_datetime(date,pcVar1,&local_18);
    if (local_18 != (bc_error_t *)0x0) {
      bc_error_print(local_18,"blogc");
      bc_error_free(local_18);
      pcVar1 = bc_strdup(date);
    }
  }
  return pcVar1;
}

Assistant:

char*
blogc_format_date(const char *date, bc_trie_t *global, bc_trie_t *local)
{
    const char *date_format = blogc_get_variable("DATE_FORMAT", global, local);
    if (date == NULL)
        return NULL;
    if (date_format == NULL)
        return bc_strdup(date);

    bc_error_t *err = NULL;
    char *rv = blogc_convert_datetime(date, date_format, &err);
    if (err != NULL) {
        bc_error_print(err, "blogc");
        bc_error_free(err);
        return bc_strdup(date);
    }
    return rv;
}